

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O0

value * mjs::anon_unknown_63::array_reduce
                  (value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                  value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args,
                  bool reduce_right)

{
  uint32_t *this;
  initializer_list<mjs::value> __l;
  bool bVar1;
  uint32_t uVar2;
  global_object *pgVar3;
  object *poVar4;
  global_object *pgVar5;
  size_type sVar6;
  const_reference rhs;
  native_error_exception *this_00;
  uint32_t index;
  uint32_t index_00;
  wstring_view wVar7;
  undefined1 auVar8 [16];
  value *local_3a8;
  value *local_318;
  allocator<mjs::value> local_2d1;
  undefined1 local_2d0 [16];
  value *local_2c0;
  value local_2b8;
  undefined1 local_290 [40];
  value local_268;
  value local_240;
  iterator local_218;
  undefined1 local_210 [32];
  value local_1f0;
  wstring_view local_1c8;
  undefined1 local_1b8 [8];
  wstring is_1;
  undefined1 local_190 [16];
  value local_180;
  wstring_view local_158;
  undefined1 local_148 [8];
  wstring is;
  basic_string_view<char,_std::char_traits<char>_> local_120;
  wstring local_110;
  wstring_view local_f0;
  undefined1 local_e0 [8];
  anon_class_16_3_7fd94aba k;
  uint32_t i;
  undefined1 local_b8 [8];
  value callback;
  value local_70;
  uint32_t local_44;
  undefined1 local_40 [4];
  uint32_t len;
  object_ptr o;
  bool reduce_right_local;
  vector<mjs::value,_std::allocator<mjs::value>_> *args_local;
  value *this__local;
  gc_heap_ptr<mjs::global_object> *global_local;
  value *accumulator;
  
  o.super_gc_heap_ptr_untyped._15_1_ = reduce_right;
  pgVar3 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar3->super_object)._vptr_object[0x11])((gc_heap_ptr<mjs::object> *)local_40,pgVar3,this_);
  poVar4 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_40);
  this = &callback.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
          super_gc_heap_ptr_untyped.pos_;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)this,L"length");
  (**poVar4->_vptr_object)(&local_70,poVar4,this);
  uVar2 = to_uint32(&local_70);
  value::~value(&local_70);
  local_44 = uVar2;
  bVar1 = std::vector<mjs::value,_std::allocator<mjs::value>_>::empty(args);
  if (bVar1) {
    local_318 = (value *)value::undefined;
  }
  else {
    local_318 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[](args,0);
  }
  value::value((value *)local_b8,local_318);
  pgVar3 = gc_heap_ptr<mjs::global_object>::operator->(global);
  pgVar5 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar5->super_object)._vptr_object[0xc])(&i);
  global_object::validate_type(pgVar3,(value *)local_b8,(object_ptr *)&i,"function");
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)&i);
  k._15_1_ = 0;
  value::value(__return_storage_ptr__,(value *)value::undefined);
  k.len = 0;
  local_e0 = (undefined1  [8])&k.len;
  k.i._0_4_ = local_44;
  k.i._4_1_ = o.super_gc_heap_ptr_untyped._15_1_ & 1;
  sVar6 = std::vector<mjs::value,_std::allocator<mjs::value>_>::size(args);
  if (sVar6 < 2) {
    do {
      if (k.len == local_44) {
        is.field_2._M_local_buf[3]._3_1_ = 1;
        this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
        pgVar3 = gc_heap_ptr<mjs::global_object>::operator->(global);
        global_object::stack_trace_abi_cxx11_(&local_110,pgVar3);
        local_f0 = (wstring_view)
                   std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_110);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_120,"cannot reduce empty array");
        native_error_exception::native_error_exception(this_00,type,&local_f0,&local_120);
        is.field_2._M_local_buf[3]._3_1_ = 0;
        __cxa_throw(this_00,&native_error_exception::typeinfo,
                    native_error_exception::~native_error_exception);
      }
      uVar2 = array_reduce::anon_class_16_3_7fd94aba::operator()
                        ((anon_class_16_3_7fd94aba *)local_e0);
      index_string_abi_cxx11_((wstring *)local_148,(mjs *)(ulong)uVar2,index);
      k.len = k.len + 1;
      poVar4 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_40);
      wVar7 = (wstring_view)
              std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)local_148);
      local_158 = wVar7;
      bVar1 = object::has_property(poVar4,&local_158);
      if (bVar1) {
        poVar4 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_40);
        auVar8 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)local_148);
        local_190 = auVar8;
        (**poVar4->_vptr_object)(&local_180,poVar4,local_190);
        value::operator=(__return_storage_ptr__,&local_180);
        value::~value(&local_180);
        is_1.field_2._M_local_buf[3] = L'\x02';
      }
      else {
        is_1.field_2._M_local_buf[3] = L'\0';
      }
      std::__cxx11::wstring::~wstring((wstring *)local_148);
    } while (is_1.field_2._M_local_buf[3] == L'\0');
  }
  else {
    rhs = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[](args,1);
    value::operator=(__return_storage_ptr__,rhs);
  }
  for (; k.len < local_44; k.len = k.len + 1) {
    uVar2 = array_reduce::anon_class_16_3_7fd94aba::operator()((anon_class_16_3_7fd94aba *)local_e0)
    ;
    index_string_abi_cxx11_((wstring *)local_1b8,(mjs *)(ulong)uVar2,index_00);
    poVar4 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_40);
    wVar7 = (wstring_view)
            std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)local_1b8);
    local_1c8 = wVar7;
    bVar1 = object::has_property(poVar4,&local_1c8);
    if (bVar1) {
      local_2c0 = &local_2b8;
      value::value(local_2c0,__return_storage_ptr__);
      local_2c0 = (value *)local_290;
      poVar4 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_40);
      auVar8 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)local_1b8);
      local_2d0 = auVar8;
      (**poVar4->_vptr_object)(local_290,poVar4,local_2d0);
      local_2c0 = &local_268;
      uVar2 = array_reduce::anon_class_16_3_7fd94aba::operator()
                        ((anon_class_16_3_7fd94aba *)local_e0);
      value::value(&local_268,(double)uVar2);
      local_2c0 = &local_240;
      value::value(local_2c0,(object_ptr *)local_40);
      local_218 = &local_2b8;
      local_210._0_8_ = 1.97626258336499e-323;
      std::allocator<mjs::value>::allocator(&local_2d1);
      __l._M_len = local_210._0_8_;
      __l._M_array = local_218;
      std::vector<mjs::value,_std::allocator<mjs::value>_>::vector
                ((vector<mjs::value,_std::allocator<mjs::value>_> *)(local_210 + 8),__l,&local_2d1);
      call_function(&local_1f0,(value *)local_b8,(value *)value::undefined,
                    (vector<mjs::value,_std::allocator<mjs::value>_> *)(local_210 + 8));
      value::operator=(__return_storage_ptr__,&local_1f0);
      value::~value(&local_1f0);
      std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
                ((vector<mjs::value,_std::allocator<mjs::value>_> *)(local_210 + 8));
      std::allocator<mjs::value>::~allocator(&local_2d1);
      local_3a8 = (value *)&local_218;
      do {
        local_3a8 = local_3a8 + -1;
        value::~value(local_3a8);
      } while (local_3a8 != &local_2b8);
    }
    std::__cxx11::wstring::~wstring((wstring *)local_1b8);
  }
  k._15_1_ = 1;
  is_1.field_2._M_local_buf[3] = L'\x01';
  value::~value((value *)local_b8);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

value array_reduce(gc_heap_ptr<global_object> global, const value& this_, const std::vector<value>& args, bool reduce_right) {
    auto o = global->to_object(this_);
    const auto len = to_uint32(o->get(L"length"));
    const auto callback = !args.empty() ? args[0] : value::undefined;
    global->validate_type(callback, global->function_prototype(), "function");

    value accumulator = value::undefined;
    // i always counts from 0 to len-1 (inclusive)
    uint32_t i = 0;
    // k() is the index to use (same as i if left reducing)
    auto k = [&i, len, reduce_right]() { return reduce_right ? len - 1 - i : i; };

    if (args.size() > 1) {
        // 7. initialValue is present
        accumulator = args[1];
    } else {
        // 6. len is 0 and initialValue is not present
        // 8. initialValue is not present
        for (;;) {
            if (i == len) {
                throw native_error_exception{native_error_type::type, global->stack_trace(), "cannot reduce empty array"};
            }
            const auto is = index_string(k());
            ++i; // increase i after having called k() for this loop but before breaking (since the value was consumed)
            if (o->has_property(is)) {
                accumulator = o->get(is);
                break;
            }
        }
    }

    for (; i < len; ++i) {
        const auto is = index_string(k());
        if (o->has_property(is)) {
            accumulator = call_function(callback, value::undefined, { accumulator, o->get(is), value{static_cast<double>(k())}, value{o} });
        }
    }

    return accumulator;
}